

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_core_impl.hpp
# Opt level: O2

TestSuite * __thiscall
iutest::UnitTestImpl::AddTestSuite<iutest::TypedTestSuite<unsigned_char>>
          (UnitTestImpl *this,string *testsuite_name,TestTypeId id,SetUpMethod setup,
          TearDownMethod teardown)

{
  TypedTestSuite<unsigned_char> *this_00;
  TypedTestSuite<unsigned_char> *local_38;
  
  local_38 = (TypedTestSuite<unsigned_char> *)FindTestSuite(this,testsuite_name,id);
  if (local_38 == (TypedTestSuite<unsigned_char> *)0x0) {
    this_00 = (TypedTestSuite<unsigned_char> *)operator_new(0xd0);
    TypedTestSuite<unsigned_char>::TypedTestSuite(this_00,testsuite_name,id,setup,teardown);
    local_38 = this_00;
    std::vector<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>::push_back
              (&this->m_testsuites,(value_type *)&local_38);
  }
  return &local_38->super_TestSuite;
}

Assistant:

TestSuite* AddTestSuite(const ::std::string& testsuite_name, TestTypeId id
        , SetUpMethod setup, TearDownMethod teardown IUTEST_APPEND_EXPLICIT_TEMPLATE_TYPE_(T) )
    {
        TestSuite* p = FindTestSuite(testsuite_name, id);
        if( p == NULL )
        {
            p = new T (testsuite_name, id, setup, teardown);
            m_testsuites.push_back(p);
        }
        return p;
    }